

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O1

SUNMemory SUNMemoryHelper_Wrap(SUNMemoryHelper helper,void *ptr,SUNMemoryType mem_type)

{
  SUNMemory pSVar1;
  
  pSVar1 = (SUNMemory)malloc(0x18);
  pSVar1->bytes = 0;
  pSVar1->ptr = ptr;
  pSVar1->own = 0;
  pSVar1->type = mem_type;
  return pSVar1;
}

Assistant:

SUNMemory SUNMemoryHelper_Wrap(SUNMemoryHelper helper, void* ptr,
                               SUNMemoryType mem_type)
{
  SUNFunctionBegin(helper->sunctx);

  SUNCheckNull(mem_type == SUNMEMTYPE_HOST || mem_type == SUNMEMTYPE_PINNED ||
                 mem_type == SUNMEMTYPE_DEVICE || mem_type == SUNMEMTYPE_UVM,
               SUN_ERR_ARG_OUTOFRANGE);

  SUNMemory mem = SUNMemoryNewEmpty(helper->sunctx);
  SUNCheckLastErrNull();

  mem->ptr  = ptr;
  mem->own  = SUNFALSE;
  mem->type = mem_type;

  return mem;
}